

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.h
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledCallIFlags<Js::OpLayoutDynamicProfile<Js::OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>_>
          *playout)

{
  Var target;
  RecyclableObject *function;
  
  target = GetRegAllowStackVar<unsigned_short>
                     (this,(playout->
                           super_OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
                           super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.Function)
  ;
  function = OP_CallGetFunc(this,target);
  OP_ProfileCallCommon<Js::OpLayoutDynamicProfile<Js::OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>__unaligned>
            (this,playout,function,
             (playout->super_OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
             callFlags,playout->profileId,0xffffffff,(AuxArray<unsigned_int> *)0x0);
  return;
}

Assistant:

void OP_ProfiledCallIFlags(const unaligned T* playout) { OP_ProfileCallCommon(playout, OP_CallGetFunc(GetRegAllowStackVar(playout->Function)), playout->callFlags, playout->profileId); }